

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessing.c
# Opt level: O2

void expand_macro(token *macro_name,Source_File *src,Translation_Data *translation_data)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  void *pvVar4;
  Queue *args;
  int *piVar5;
  token *ptVar6;
  long *plVar7;
  undefined1 auVar8 [16];
  
  if (macro_name->type == KW_ID) {
    pvVar4 = Map_Check(translation_data->macros,macro_name->data,macro_name->data_size);
    if (pvVar4 != (void *)0x0) {
      free(macro_name);
      args = make_define_argument_list(*(size_t *)((long)pvVar4 + 0x18));
      load_macro_arguments(args,*(size_t *)((long)pvVar4 + 0x18),src,translation_data);
      if (translation_data->errors->size == 0) {
        plVar7 = *(long **)((long)pvVar4 + 8);
        while (puVar3 = (undefined8 *)*plVar7, puVar3 != (undefined8 *)0x0) {
          ptVar6 = (token *)*puVar3;
          piVar5 = (int *)Map_Check(*(Map **)((long)pvVar4 + 0x10),ptVar6->data,ptVar6->data_size);
          if (piVar5 == (int *)0x0) {
            ptVar6 = copy_token(ptVar6);
            uVar1 = src->which_column;
            uVar2 = src->which_row;
            auVar8._8_4_ = (int)uVar1;
            auVar8._0_8_ = uVar2;
            auVar8._12_4_ = (int)((ulong)uVar1 >> 0x20);
            ptVar6->line = uVar2;
            ptVar6->column = auVar8._8_8_;
            Queue_Push(translation_data->tokens,ptVar6);
          }
          else {
            expand_macro_argument(args + *piVar5,src,translation_data);
          }
          plVar7 = puVar3 + 1;
        }
      }
      delete_define_argument_list(*(size_t *)((long)pvVar4 + 0x18),args);
      return;
    }
  }
  Queue_Push(translation_data->tokens,macro_name);
  return;
}

Assistant:

void expand_macro(struct token* macro_name,struct Source_File *src,struct Translation_Data *translation_data)
{
	struct define_directive *hold=NULL;
	struct token *hold_token;
	int *index;
	struct Queue_Node *it;
	struct Queue *argument_list;

	if(macro_name->type==KW_ID)
		hold=Map_Check(translation_data->macros,macro_name->data,macro_name->data_size);
	if(hold!=NULL)
	{
		free(macro_name);
		argument_list=make_define_argument_list(hold->number_of_arguments);
		load_macro_arguments(argument_list,hold->number_of_arguments,src,translation_data);
		if(translation_data->errors->size>0)
		{
			delete_define_argument_list(hold->number_of_arguments,argument_list);
			return;
		}

		
		for(it=hold->macro_tokens->first;it!=NULL;it=it->prev)
		{
			hold_token=(struct token*)it->data;
			index=Map_Check(hold->arguments,hold_token->data,hold_token->data_size);
			if(index!=NULL)
			{
				expand_macro_argument(argument_list+*index,src,translation_data);
			}else
			{
				hold_token=copy_token(hold_token);

				hold_token->line=src->which_row;
				hold_token->column=src->which_column;

				Queue_Push(translation_data->tokens,hold_token);
			}
		}
		delete_define_argument_list(hold->number_of_arguments,argument_list);
	}else
	{
		/*this isn't a macro, so we just push it to the token queue*/
		Queue_Push(translation_data->tokens,macro_name);
	}
}